

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::languageDisplayName
          (LocaleDisplayNamesImpl *this,char *lang,UnicodeString *result)

{
  UBool UVar1;
  int iVar2;
  char *pcVar3;
  UnicodeString *pUVar4;
  UnicodeString local_68;
  UnicodeString *local_28;
  UnicodeString *result_local;
  char *lang_local;
  LocaleDisplayNamesImpl *this_local;
  
  local_28 = result;
  result_local = (UnicodeString *)lang;
  lang_local = (char *)this;
  iVar2 = strcmp("root",lang);
  if ((iVar2 == 0) || (pcVar3 = strchr((char *)result_local,0x5f), pcVar3 != (char *)0x0)) {
    icu_63::UnicodeString::UnicodeString(&local_68,(char *)result_local,-1,kInvariant);
    this_local = (LocaleDisplayNamesImpl *)icu_63::UnicodeString::operator=(local_28,&local_68);
    icu_63::UnicodeString::~UnicodeString(&local_68);
  }
  else {
    if (this->nameLength == UDISPCTX_LENGTH_SHORT) {
      ICUDataTable::get(&this->langData,"Languages%short",(char *)result_local,local_28);
      UVar1 = icu_63::UnicodeString::isBogus(local_28);
      if (UVar1 == '\0') {
        pUVar4 = adjustForUsageAndContext(this,kCapContextUsageLanguage,local_28);
        return pUVar4;
      }
    }
    ICUDataTable::get(&this->langData,"Languages",(char *)result_local,local_28);
    this_local = (LocaleDisplayNamesImpl *)
                 adjustForUsageAndContext(this,kCapContextUsageLanguage,local_28);
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::languageDisplayName(const char* lang,
                                            UnicodeString& result) const {
    if (uprv_strcmp("root", lang) == 0 || uprv_strchr(lang, '_') != NULL) {
        return result = UnicodeString(lang, -1, US_INV);
    }
    if (nameLength == UDISPCTX_LENGTH_SHORT) {
        langData.get("Languages%short", lang, result);
        if (!result.isBogus()) {
            return adjustForUsageAndContext(kCapContextUsageLanguage, result);
        }
    }
    langData.get("Languages", lang, result);
    return adjustForUsageAndContext(kCapContextUsageLanguage, result);
}